

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O3

void __thiscall
event_track::EventMessageInstanceBox::EventMessageInstanceBox
          (EventMessageInstanceBox *this,DASHEventMessageBoxv1 *e,uint64_t pres_time)

{
  pointer pcVar1;
  uint32_t uVar2;
  
  (this->super_full_box).super_box.size_ = 0;
  (this->super_full_box).super_box.large_size_ = 0;
  (this->super_full_box).super_box.box_type_._M_dataplus._M_p =
       (pointer)&(this->super_full_box).super_box.box_type_.field_2;
  (this->super_full_box).super_box.box_type_._M_string_length = 0;
  (this->super_full_box).super_box.box_type_.field_2._M_local_buf[0] = '\0';
  (this->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->super_full_box).super_box.field_0x62 = 0;
  *(undefined8 *)&(this->super_full_box).super_box.field_0x64 = 0;
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_0011eaf8;
  *(undefined4 *)&(this->super_full_box).field_0x6c = *(undefined4 *)&(e->super_full_box).field_0x6c
  ;
  uVar2 = e->id_;
  this->event_duration_ = e->event_duration_;
  this->id_ = uVar2;
  (this->scheme_id_uri_)._M_dataplus._M_p = (pointer)&(this->scheme_id_uri_).field_2;
  pcVar1 = (e->scheme_id_uri_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->scheme_id_uri_,pcVar1,pcVar1 + (e->scheme_id_uri_)._M_string_length);
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  pcVar1 = (e->value_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value_,pcVar1,pcVar1 + (e->value_)._M_string_length);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->message_data_,&e->message_data_);
  this->presentation_time_delta_ = e->presentation_time_ - pres_time;
  return;
}

Assistant:

EventMessageInstanceBox(DASHEventMessageBoxv1 e, uint64_t pres_time)
			: reserved_(e.timescale_), event_duration_(e.event_duration_), \
			id_(e.id_), scheme_id_uri_(e.scheme_id_uri_), \
			value_(e.value_), message_data_(e.message_data_)
		{
			presentation_time_delta_ = e.presentation_time_ - pres_time;
		}